

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  array<char,_512UL> *paVar1;
  byte byte;
  error_handler_t eVar2;
  uint8_t uVar3;
  _func_int **pp_Var4;
  type_error *ptVar5;
  long lVar6;
  char *pcVar7;
  element_type *peVar8;
  ulong __val;
  long lVar9;
  undefined8 uStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string sn;
  uint32_t codepoint;
  long local_50;
  uint8_t local_31 [8];
  uint8_t state;
  
  local_31[0] = '\0';
  paVar1 = &this->string_buffer;
  local_50 = 0;
  lVar6 = 0;
  __val = 0;
  lVar9 = 0;
  do {
    if (s->_M_string_length <= __val) {
      if (local_31[0] == '\0') {
        if (lVar9 == 0) {
          return;
        }
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pp_Var4 = peVar8->_vptr_output_adapter_protocol;
        local_50 = lVar9;
      }
      else {
        eVar2 = this->error_handler;
        if (eVar2 == replace) {
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,paVar1,local_50);
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (ensure_ascii) {
            pcVar7 = "\\ufffd";
            uStack_110 = 6;
          }
          else {
            pcVar7 = anon_var_dwarf_26c8a;
            uStack_110 = 3;
          }
          (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,pcVar7,uStack_110);
          return;
        }
        if (eVar2 != ignore) {
          if (eVar2 != strict) {
            return;
          }
          local_80 = (undefined1  [8])&sn._M_string_length;
          std::__cxx11::string::_M_construct((ulong)local_80,'\x03');
          snprintf((char *)local_80,(size_t)sn._M_dataplus._M_p,"%.2X",
                   (ulong)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1]);
          ptVar5 = (type_error *)__cxa_allocate_exception(0x20);
          std::operator+(&local_a0,"incomplete UTF-8 string; last byte: 0x",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          type_error::create(ptVar5,0x13c,&local_a0);
          __cxa_throw(ptVar5,&type_error::typeinfo,exception::~exception);
        }
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pp_Var4 = peVar8->_vptr_output_adapter_protocol;
      }
      (*pp_Var4[1])(peVar8,paVar1,local_50);
      return;
    }
    byte = (s->_M_dataplus)._M_p[__val];
    uVar3 = decode(local_31,(uint32_t *)(sn.field_2._M_local_buf + 0xc),byte);
    if (uVar3 == '\x01') {
      eVar2 = this->error_handler;
      if (1 < eVar2 - replace) {
        if (eVar2 == strict) {
          local_80 = (undefined1  [8])&sn._M_string_length;
          std::__cxx11::string::_M_construct((ulong)local_80,'\x03');
          snprintf((char *)local_80,(size_t)sn._M_dataplus._M_p,"%.2X",(ulong)byte);
          ptVar5 = (type_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::to_string(&local_c0,__val);
          std::operator+(&local_e0,"invalid UTF-8 byte at index ",&local_c0);
          std::operator+(&local_100,&local_e0,": 0x");
          std::operator+(&local_a0,&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          type_error::create(ptVar5,0x13c,&local_a0);
          __cxa_throw(ptVar5,&type_error::typeinfo,exception::~exception);
        }
        goto LAB_0014320f;
      }
      __val = (__val - 1) + (ulong)(lVar6 == 0);
      if (eVar2 == replace) {
        if (ensure_ascii) {
          builtin_strncpy(paVar1->_M_elems + local_50,"\\ufffd",6);
          local_50 = local_50 + 6;
        }
        else {
          (paVar1->_M_elems + local_50)[0] = -0x11;
          (paVar1->_M_elems + local_50)[1] = -0x41;
          (this->string_buffer)._M_elems[local_50 + 2] = -0x43;
          local_50 = local_50 + 3;
        }
      }
      local_31[0] = '\0';
      lVar9 = local_50;
LAB_00143209:
      lVar6 = 0;
      local_50 = lVar9;
    }
    else if (uVar3 == '\0') {
      switch(sn.field_2._12_4_) {
      case 8:
        (paVar1->_M_elems + lVar9)[0] = '\\';
        (paVar1->_M_elems + lVar9)[1] = 'b';
        break;
      case 9:
        (paVar1->_M_elems + lVar9)[0] = '\\';
        (paVar1->_M_elems + lVar9)[1] = 't';
        break;
      case 10:
        (paVar1->_M_elems + lVar9)[0] = '\\';
        (paVar1->_M_elems + lVar9)[1] = 'n';
        break;
      case 0xb:
switchD_00143077_caseD_b:
        if ((uint)sn.field_2._12_4_ < 0x20 || ensure_ascii && 0x7e < (uint)sn.field_2._12_4_) {
          if ((uint)sn.field_2._12_4_ < 0x10000) {
            snprintf(paVar1->_M_elems + lVar9,7,"\\u%04x",(ulong)(uint)sn.field_2._12_4_);
            lVar9 = lVar9 + 6;
          }
          else {
            snprintf(paVar1->_M_elems + lVar9,0xd,"\\u%04x\\u%04x",
                     (ulong)(((uint)sn.field_2._12_4_ >> 10) + 0xd7c0 & 0xffff),
                     (ulong)(sn.field_2._12_4_ & 0x3ff | 0xdc00));
            lVar9 = lVar9 + 0xc;
          }
        }
        else {
          paVar1->_M_elems[lVar9] = (s->_M_dataplus)._M_p[__val];
          lVar9 = lVar9 + 1;
        }
        goto LAB_001431d9;
      case 0xc:
        (paVar1->_M_elems + lVar9)[0] = '\\';
        (paVar1->_M_elems + lVar9)[1] = 'f';
        break;
      case 0xd:
        (paVar1->_M_elems + lVar9)[0] = '\\';
        (paVar1->_M_elems + lVar9)[1] = 'r';
        break;
      default:
        if (sn.field_2._12_4_ == 0x22) {
          (paVar1->_M_elems + lVar9)[0] = '\\';
          (paVar1->_M_elems + lVar9)[1] = '\"';
        }
        else {
          if (sn.field_2._12_4_ != 0x5c) goto switchD_00143077_caseD_b;
          (paVar1->_M_elems + lVar9)[0] = '\\';
          (paVar1->_M_elems + lVar9)[1] = '\\';
        }
      }
      lVar9 = lVar9 + 2;
LAB_001431d9:
      if (0xc < lVar9 - 500U) goto LAB_00143209;
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,paVar1,lVar9);
      local_50 = 0;
      lVar6 = 0;
      lVar9 = 0;
    }
    else {
      if (!ensure_ascii) {
        paVar1->_M_elems[lVar9] = (s->_M_dataplus)._M_p[__val];
        lVar9 = lVar9 + 1;
      }
      lVar6 = lVar6 + 1;
    }
LAB_0014320f:
    __val = __val + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        // number of bytes written at the point of the last valid byte
        std::size_t bytes_after_last_accept = 0;
        std::size_t undumped_chars = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 7, "\\u%04x",
                                                    static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                    static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                    static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }

                    // remember the byte position of this accept
                    bytes_after_last_accept = bytes;
                    undumped_chars = 0;
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    switch (error_handler)
                    {
                        case error_handler_t::strict:
                        {
                            std::string sn(3, '\0');
                            (std::snprintf)(&sn[0], sn.size(), "%.2X", byte);
                            JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                        }

                        case error_handler_t::ignore:
                        case error_handler_t::replace:
                        {
                            // in case we saw this character the first time, we
                            // would like to read it again, because the byte
                            // may be OK for itself, but just not OK for the
                            // previous sequence
                            if (undumped_chars > 0)
                            {
                                --i;
                            }

                            // reset length buffer to the last accepted index;
                            // thus removing/ignoring the invalid characters
                            bytes = bytes_after_last_accept;

                            if (error_handler == error_handler_t::replace)
                            {
                                // add a replacement character
                                if (ensure_ascii)
                                {
                                    string_buffer[bytes++] = '\\';
                                    string_buffer[bytes++] = 'u';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'd';
                                }
                                else
                                {
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xEF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBD');
                                }
                                bytes_after_last_accept = bytes;
                            }

                            undumped_chars = 0;

                            // continue processing the string
                            state = UTF8_ACCEPT;
                            break;
                        }
                    }
                    break;
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    ++undumped_chars;
                    break;
                }
            }
        }

        // we finished processing the string
        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            switch (error_handler)
            {
                case error_handler_t::strict:
                {
                    std::string sn(3, '\0');
                    (std::snprintf)(&sn[0], sn.size(), "%.2X", static_cast<uint8_t>(s.back()));
                    JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
                }

                case error_handler_t::ignore:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    break;
                }

                case error_handler_t::replace:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    // add a replacement character
                    if (ensure_ascii)
                    {
                        o->write_characters("\\ufffd", 6);
                    }
                    else
                    {
                        o->write_characters("\xEF\xBF\xBD", 3);
                    }
                    break;
                }
            }
        }
    }